

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs.c
# Opt level: O2

Qiniu_Error
Qiniu_RS_BatchMove(Qiniu_Client *self,Qiniu_RS_BatchItemRet *rets,Qiniu_RS_EntryPathPair *entryPairs
                  ,Qiniu_ItemCount entryCount)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *s1;
  char *buf;
  char *__ptr;
  char *s3;
  size_t bodyLen;
  cJSON *pcVar4;
  Qiniu_Int64 QVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  char *__s;
  int *piVar10;
  Qiniu_Error QVar11;
  Qiniu_Error QVar12;
  char *rsHost;
  cJSON *root;
  char *local_40;
  cJSON *local_38;
  
  QVar11 = _Qiniu_Region_Get_Rs_Host(self,(char *)0x0,(entryPairs->src).bucket,&local_40);
  if (QVar11.code == 200) {
    pcVar2 = Qiniu_String_Concat2(local_40,"/batch");
    uVar6 = (ulong)(uint)entryCount;
    if (entryCount < 1) {
      uVar6 = 0;
    }
    __s = (char *)0x0;
    for (lVar8 = 0; uVar6 * 0x28 != lVar8; lVar8 = lVar8 + 0x28) {
      pcVar3 = Qiniu_String_Concat3
                         (*(char **)((long)&(entryPairs->src).bucket + lVar8),":",
                          *(char **)((long)&(entryPairs->src).key + lVar8));
      s1 = Qiniu_String_Encode(pcVar3);
      buf = Qiniu_String_Concat3
                      (*(char **)((long)&(entryPairs->dest).bucket + lVar8),":",
                       *(char **)((long)&(entryPairs->dest).key + lVar8));
      __ptr = Qiniu_String_Encode(buf);
      pcVar7 = "0";
      if (*(int *)((long)&entryPairs->force + lVar8) == 1) {
        pcVar7 = "1";
      }
      pcVar7 = Qiniu_String_Concat(s1,"/",__ptr,"/force/",pcVar7,0);
      s3 = Qiniu_String_Concat2("op=/move/",pcVar7);
      free(pcVar3);
      free(s1);
      free(buf);
      free(__ptr);
      free(pcVar7);
      pcVar3 = s3;
      if (__s != (char *)0x0) {
        pcVar3 = Qiniu_String_Concat3(__s,"&",s3);
        free(s3);
      }
      free(__s);
      __s = pcVar3;
    }
    bodyLen = strlen(__s);
    QVar12 = Qiniu_Client_CallWithBuffer
                       (self,&local_38,pcVar2,__s,bodyLen,"application/x-www-form-urlencoded");
    free(pcVar2);
    free(__s);
    uVar1 = cJSON_GetArraySize(local_38);
    uVar9 = 0;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar9;
    }
    piVar10 = &rets->code;
    for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      pcVar4 = cJSON_GetArrayItem(local_38,(int)uVar9);
      QVar5 = Qiniu_Json_GetInt64(pcVar4,"code",0);
      pcVar4 = cJSON_GetObjectItem(pcVar4,"data");
      *piVar10 = (int)QVar5;
      if ((int)QVar5 != 200) {
        pcVar2 = Qiniu_Json_GetString(pcVar4,"error",(char *)0x0);
        ((Qiniu_RS_BatchItemRet *)(piVar10 + -2))->error = pcVar2;
      }
      piVar10 = piVar10 + 4;
    }
    QVar11._4_4_ = 0;
    QVar11.code = QVar12.code;
    QVar11.message = QVar12.message;
  }
  return QVar11;
}

Assistant:

Qiniu_Error Qiniu_RS_BatchMove(
    Qiniu_Client *self, Qiniu_RS_BatchItemRet *rets,
    Qiniu_RS_EntryPathPair *entryPairs, Qiniu_ItemCount entryCount)
{
    int code;
    Qiniu_Error err;
    cJSON *root, *arrayItem, *dataItem;
    char *body = NULL, *bodyTmp = NULL;
    char *entryURISrc, *entryURISrcEncoded, *opBody;
    char *entryURIDest, *entryURIDestEncoded, *bodyPart;
    Qiniu_ItemCount curr = 0;
    Qiniu_ItemCount retSize = 0;
    Qiniu_RS_EntryPathPair *entryPair = entryPairs;
    const char *rsHost;

    err = _Qiniu_Region_Get_Rs_Host(self, NULL, entryPair->src.bucket, &rsHost);
    if (err.code != 200)
    {
        return err;
    }

    char *url = Qiniu_String_Concat2(rsHost, "/batch");

    curr = 0;
    while (curr < entryCount)
    {
        entryURISrc = Qiniu_String_Concat3(entryPair->src.bucket, ":", entryPair->src.key);
        entryURISrcEncoded = Qiniu_String_Encode(entryURISrc);
        entryURIDest = Qiniu_String_Concat3(entryPair->dest.bucket, ":", entryPair->dest.key);
        entryURIDestEncoded = Qiniu_String_Encode(entryURIDest);

        char *forceStr = "0";
        if (entryPair->force == Qiniu_True)
        {
            forceStr = "1";
        }

        bodyPart = Qiniu_String_Concat(entryURISrcEncoded, "/", entryURIDestEncoded, "/force/", forceStr, NULL);
        opBody = Qiniu_String_Concat2("op=/move/", bodyPart);
        free(entryURISrc);
        free(entryURISrcEncoded);
        free(entryURIDest);
        free(entryURIDestEncoded);
        free(bodyPart);

        if (!body)
        {
            bodyTmp = opBody;
        }
        else
        {
            bodyTmp = Qiniu_String_Concat3(body, "&", opBody);
            free(opBody);
        }
        free(body);
        body = bodyTmp;
        curr++;
        entryPair = &entryPairs[curr];
    }

    err = Qiniu_Client_CallWithBuffer(self, &root,
                                      url, body, strlen(body), "application/x-www-form-urlencoded");
    free(url);
    free(body);

    retSize = cJSON_GetArraySize(root);

    curr = 0;
    while (curr < retSize)
    {
        arrayItem = cJSON_GetArrayItem(root, curr);
        code = (int)Qiniu_Json_GetInt64(arrayItem, "code", 0);
        dataItem = cJSON_GetObjectItem(arrayItem, "data");

        rets[curr].code = code;

        if (code != 200)
        {
            rets[curr].error = Qiniu_Json_GetString(dataItem, "error", 0);
        }
        curr++;
    }

    return err;
}